

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

ctl_named_node_t * arena_i_index(tsdn_t *tsdn,size_t *mib,size_t miblen,size_t i)

{
  ulong in_RCX;
  malloc_mutex_t *in_RDX;
  tsdn_t *in_RSI;
  tsdn_t *in_RDI;
  ctl_named_node_t *ret;
  ctl_named_node_t *local_28;
  
  malloc_mutex_lock(in_RDI,(malloc_mutex_t *)in_RSI);
  if ((in_RCX - 0x1000 < 2) || (in_RCX <= ctl_arenas->narenas)) {
    local_28 = super_arena_i_node;
  }
  else {
    local_28 = (ctl_named_node_t *)0x0;
  }
  malloc_mutex_unlock(in_RSI,in_RDX);
  return local_28;
}

Assistant:

static const ctl_named_node_t *
arena_i_index(tsdn_t *tsdn, const size_t *mib, size_t miblen,
    size_t i) {
	const ctl_named_node_t *ret;

	malloc_mutex_lock(tsdn, &ctl_mtx);
	switch (i) {
	case MALLCTL_ARENAS_ALL:
	case MALLCTL_ARENAS_DESTROYED:
		break;
	default:
		if (i > ctl_arenas->narenas) {
			ret = NULL;
			goto label_return;
		}
		break;
	}

	ret = super_arena_i_node;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}